

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt_pp.h
# Opt level: O0

Result GetOpt::convert<int>(string *s,int *result,fmtflags flags)

{
  byte bVar1;
  long local_1b0;
  stringstream ss;
  ostream local_1a0 [380];
  fmtflags local_24;
  int *piStack_20;
  fmtflags flags_local;
  int *result_local;
  string *s_local;
  
  local_24 = flags;
  piStack_20 = result;
  result_local = (int *)s;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b0);
  std::ios::clear((int)&local_1b0 + (int)*(undefined8 *)(local_1b0 + -0x18));
  std::ios_base::flags((ios_base *)((long)&local_1b0 + *(long *)(local_1b0 + -0x18)),local_24);
  std::operator<<(local_1a0,(string *)result_local);
  std::istream::operator>>((istream *)&local_1b0,piStack_20);
  bVar1 = std::ios::fail();
  if (((bVar1 & 1) == 0) && (bVar1 = std::ios::eof(), (bVar1 & 1) != 0)) {
    s_local._4_4_ = OK;
  }
  else {
    s_local._4_4_ = BadType;
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b0);
  return s_local._4_4_;
}

Assistant:

inline _Option::Result convert(const std::string& s, T& result, std::ios::fmtflags flags)
{
    std::stringstream ss;
    ss.clear();
    ss.flags(flags);
    ss << s;
    ss >> result;
    if (ss.fail() || !ss.eof())
        return _Option::BadType;
    else
        return _Option::OK;
}